

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_strxspn(char *s,char *n,size_t len)

{
  int iVar1;
  char cVar2;
  char cVar3;
  __int32_t *p_Var4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar8 = s;
  if (0 < (long)len) {
    cVar2 = *n;
    pcVar7 = s;
    while (pcVar8 = s, cVar2 != '\0') {
      pp_Var5 = __ctype_tolower_loc();
      p_Var4 = *pp_Var5;
      iVar1 = p_Var4[cVar2];
      bVar9 = (long)cVar2 == 0;
      pcVar6 = n + 1;
      while (pcVar8 = pcVar7, p_Var4[*pcVar7] != iVar1) {
        cVar3 = *pcVar6;
        bVar9 = (long)cVar3 == 0;
        if (bVar9) goto LAB_001054ac;
        pcVar6 = pcVar6 + 1;
        iVar1 = p_Var4[cVar3];
      }
      if ((bVar9) || (pcVar7 = pcVar7 + 1, pcVar8 = pcVar7, s + len <= pcVar7)) break;
    }
  }
LAB_001054ac:
  return (long)pcVar8 - (long)s;
}

Assistant:

size_t coda_strxspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}